

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O2

void ASDCP::JP2K::PictureDescriptorDump(PictureDescriptor *PDesc,FILE *stream)

{
  ui16_t *puVar1;
  ushort uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  i32_t i;
  uint uVar6;
  ui8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  char tmp_buf [512];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  fprintf((FILE *)stream,
          "       AspectRatio: %d/%d\n          EditRate: %d/%d\n        SampleRate: %d/%d\n       StoredWidth: %u\n      StoredHeight: %u\n             Rsize: %u\n             Xsize: %u\n             Ysize: %u\n            XOsize: %u\n            YOsize: %u\n            XTsize: %u\n            YTsize: %u\n           XTOsize: %u\n           YTOsize: %u\n ContainerDuration: %u\n"
          ,(ulong)(uint)(PDesc->AspectRatio).Numerator,(ulong)(uint)(PDesc->AspectRatio).Denominator
          ,(ulong)(uint)(PDesc->EditRate).Numerator,(ulong)(uint)(PDesc->EditRate).Denominator,
          (ulong)(uint)(PDesc->SampleRate).Numerator,(ulong)(uint)(PDesc->SampleRate).Denominator,
          (ulong)PDesc->StoredWidth,(ulong)PDesc->StoredHeight,(ulong)PDesc->Rsize,
          (ulong)PDesc->Xsize,(ulong)PDesc->Ysize,(ulong)PDesc->XOsize,(ulong)PDesc->YOsize,
          (ulong)PDesc->XTsize,(ulong)PDesc->YTsize,(ulong)PDesc->XTOsize,(ulong)PDesc->YTOsize,
          (ulong)PDesc->ContainerDuration);
  fwrite("-- JPEG 2000 Metadata --\n",0x19,1,(FILE *)stream);
  fwrite("    ImageComponents:\n",0x15,1,(FILE *)stream);
  fwrite("  bits  h-sep v-sep\n",0x14,1,(FILE *)stream);
  puVar7 = &PDesc->ImageComponents[0].YRsize;
  for (uVar8 = 0; (uVar8 < 3 && (uVar8 < PDesc->Csize)); uVar8 = uVar8 + 1) {
    fprintf((FILE *)stream,"  %4d  %5d %5d\n",
            (ulong)(((ImageComponent_t *)(puVar7 + -2))->Ssize + 1),(ulong)puVar7[-1],(ulong)*puVar7
           );
    puVar7 = puVar7 + 3;
  }
  fprintf((FILE *)stream,"               Scod: %hhu\n",(ulong)(PDesc->CodingStyleDefault).Scod);
  fprintf((FILE *)stream,"   ProgressionOrder: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  uVar2 = *(ushort *)(PDesc->CodingStyleDefault).SGcod.NumberOfLayers;
  fprintf((FILE *)stream,"     NumberOfLayers: %hd\n",(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  fprintf((FILE *)stream," MultiCompTransform: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  fprintf((FILE *)stream,"DecompositionLevels: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  fprintf((FILE *)stream,"     CodeblockWidth: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth);
  fprintf((FILE *)stream,"    CodeblockHeight: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  fprintf((FILE *)stream,"     CodeblockStyle: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle);
  fprintf((FILE *)stream,"     Transformation: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.Transformation);
  for (uVar8 = 0; (uVar8 < 0x20 && ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar8] != '\0'));
      uVar8 = uVar8 + 1) {
  }
  fprintf((FILE *)stream,"          Precincts: %u\n",uVar8 & 0xffffffff);
  fwrite("precinct dimensions:\n",0x15,1,(FILE *)stream);
  uVar9 = 0;
  while (uVar8 != uVar9) {
    bVar4 = (PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar9];
    uVar9 = uVar9 + 1;
    fprintf((FILE *)stream,"    %d: %d x %d\n",uVar9 & 0xffffffff,
            (ulong)(uint)s_exp_lookup[bVar4 & 0xf],(ulong)(uint)s_exp_lookup[bVar4 >> 4]);
  }
  fprintf((FILE *)stream,"               Sqcd: %hhu\n",(ulong)(PDesc->QuantizationDefault).Sqcd);
  uVar3 = Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                        (uint)(PDesc->QuantizationDefault).SPqcdLength,tmp_buf,0x200);
  fprintf((FILE *)stream,"              SPqcd: %s\n",uVar3);
  if ((PDesc->Profile).N != 0) {
    fwrite("               Profile:\n",0x18,1,(FILE *)stream);
    uVar8 = 0;
    while (uVar8 < (PDesc->Profile).N) {
      puVar1 = (PDesc->Profile).Pprf + uVar8;
      uVar8 = uVar8 + 1;
      fprintf((FILE *)stream,"              Pprf(%d): %hx\n",uVar8 & 0xffffffff,(ulong)*puVar1);
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    fwrite("Corresponding Profile:\n",0x17,1,(FILE *)stream);
    uVar8 = 0;
    while (uVar8 < (PDesc->CorrespondingProfile).N) {
      puVar1 = (PDesc->CorrespondingProfile).Pcpf + uVar8;
      uVar8 = uVar8 + 1;
      fprintf((FILE *)stream,"              Pcpf(%d): %hx\n",uVar8 & 0xffffffff,(ulong)*puVar1);
    }
  }
  if ((PDesc->ExtendedCapabilities).N == -1) {
    return;
  }
  fprintf((FILE *)stream,"Extended Capabilities: %x\n",(ulong)(PDesc->ExtendedCapabilities).Pcap);
  uVar5 = 0;
  uVar6 = 0;
  do {
    do {
      if (0x1f < uVar5) {
        return;
      }
      if ((int)(PDesc->ExtendedCapabilities).N <= (int)uVar6) {
        return;
      }
      bVar4 = (byte)uVar5;
      uVar5 = uVar5 + 1;
    } while (((PDesc->ExtendedCapabilities).Pcap << (bVar4 & 0x1f) & 0x80000000) == 0);
    uVar8 = (ulong)uVar6;
    uVar6 = uVar6 + 1;
    fprintf((FILE *)stream,"           Ccap(%d): %hx\n",(ulong)uVar5,
            (ulong)(PDesc->ExtendedCapabilities).Ccap[uVar8]);
  } while( true );
}

Assistant:

void
ASDCP::JP2K::PictureDescriptorDump(const PictureDescriptor& PDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  fprintf(stream, "\
       AspectRatio: %d/%d\n\
          EditRate: %d/%d\n\
        SampleRate: %d/%d\n\
       StoredWidth: %u\n\
      StoredHeight: %u\n\
             Rsize: %u\n\
             Xsize: %u\n\
             Ysize: %u\n\
            XOsize: %u\n\
            YOsize: %u\n\
            XTsize: %u\n\
            YTsize: %u\n\
           XTOsize: %u\n\
           YTOsize: %u\n\
 ContainerDuration: %u\n",
	  PDesc.AspectRatio.Numerator, PDesc.AspectRatio.Denominator,
	  PDesc.EditRate.Numerator, PDesc.EditRate.Denominator,
	  PDesc.SampleRate.Numerator, PDesc.SampleRate.Denominator,
	  PDesc.StoredWidth,
	  PDesc.StoredHeight,
	  PDesc.Rsize,
	  PDesc.Xsize,
	  PDesc.Ysize,
	  PDesc.XOsize,
	  PDesc.YOsize,
	  PDesc.XTsize,
	  PDesc.YTsize,
	  PDesc.XTOsize,
	  PDesc.YTOsize,
	  PDesc.ContainerDuration
	  );

  fprintf(stream, "-- JPEG 2000 Metadata --\n");
  fprintf(stream, "    ImageComponents:\n");
  fprintf(stream, "  bits  h-sep v-sep\n");

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; i++ )
    {
      fprintf(stream, "  %4d  %5d %5d\n",
	      PDesc.ImageComponents[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
	      PDesc.ImageComponents[i].XRsize,
	      PDesc.ImageComponents[i].YRsize
	      );
    }
  
  fprintf(stream, "               Scod: %hhu\n", PDesc.CodingStyleDefault.Scod);
  fprintf(stream, "   ProgressionOrder: %hhu\n", PDesc.CodingStyleDefault.SGcod.ProgressionOrder);
  fprintf(stream, "     NumberOfLayers: %hd\n",
	  KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)));

  fprintf(stream, " MultiCompTransform: %hhu\n", PDesc.CodingStyleDefault.SGcod.MultiCompTransform);
  fprintf(stream, "DecompositionLevels: %hhu\n", PDesc.CodingStyleDefault.SPcod.DecompositionLevels);
  fprintf(stream, "     CodeblockWidth: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockWidth);
  fprintf(stream, "    CodeblockHeight: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockHeight);
  fprintf(stream, "     CodeblockStyle: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockStyle);
  fprintf(stream, "     Transformation: %hhu\n", PDesc.CodingStyleDefault.SPcod.Transformation);


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  fprintf(stream, "          Precincts: %u\n", precinct_set_size);
  fprintf(stream, "precinct dimensions:\n");

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; i++ )
    fprintf(stream, "    %d: %d x %d\n", i + 1,
	    s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f],
	    s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f]
	    );

  fprintf(stream, "               Sqcd: %hhu\n", PDesc.QuantizationDefault.Sqcd);

  char tmp_buf[MaxDefaults*2];
  fprintf(stream, "              SPqcd: %s\n",
	  Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength,
			tmp_buf, MaxDefaults*2)
	  );


  if (PDesc.Profile.N != 0) {
	  fprintf(stream, "               Profile:\n");

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {

		  fprintf(stream, "              Pprf(%d): %hx\n", i + 1, PDesc.Profile.Pprf[i]);

	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  fprintf(stream, "Corresponding Profile:\n");

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {
		  fprintf(stream, "              Pcpf(%d): %hx\n", i + 1, PDesc.CorrespondingProfile.Pcpf[i]);

	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled) {

	  fprintf(stream, "Extended Capabilities: %x\n", PDesc.ExtendedCapabilities.Pcap);

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities && i < PDesc.ExtendedCapabilities.N; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> (JP2K::MaxCapabilities - b - 1)) & 0x1) {

			  fprintf(stream, "           Ccap(%d): %hx\n", b + 1, PDesc.ExtendedCapabilities.Ccap[i++]);

		  }
	  }

  }
  
}